

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ApplicativeHelper.cpp
# Opt level: O0

void ApplicativeHelper::getHeadAndArgs(TermList term,TermList *head,TermStack *args)

{
  bool bVar1;
  Term *pTVar2;
  TermList *pTVar3;
  Stack<Kernel::TermList> *in_RDX;
  uint64_t *in_RSI;
  uint64_t in_RDI;
  Stack<Kernel::TermList> *this;
  TermList in_stack_ffffffffffffffe0;
  uint64_t local_8;
  
  bVar1 = Lib::Stack<Kernel::TermList>::isEmpty(in_RDX);
  local_8 = in_RDI;
  if (!bVar1) {
    Lib::Stack<Kernel::TermList>::reset(in_RDX);
  }
  while (bVar1 = Kernel::TermList::isApplication((TermList *)in_stack_ffffffffffffffe0._content),
        bVar1) {
    this = in_RDX;
    pTVar2 = Kernel::TermList::term((TermList *)0x8411d0);
    pTVar3 = Kernel::Term::nthArgument(pTVar2,3);
    in_stack_ffffffffffffffe0._content = pTVar3->_content;
    Lib::Stack<Kernel::TermList>::push(this,in_stack_ffffffffffffffe0);
    pTVar2 = Kernel::TermList::term((TermList *)0x8411fd);
    pTVar3 = Kernel::Term::nthArgument(pTVar2,2);
    local_8 = pTVar3->_content;
  }
  *in_RSI = local_8;
  return;
}

Assistant:

void ApplicativeHelper::getHeadAndArgs(TermList term, TermList& head, TermStack& args)
{
  if(!args.isEmpty()){ args.reset(); }

  while(term.isApplication()){
    args.push(*term.term()->nthArgument(3)); 
    term = *term.term()->nthArgument(2);
  }
  head = term;

}